

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodePtr xmlXPathNextFollowingSibling(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlNodePtr cur_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else if ((ctxt->context->node->type == XML_ATTRIBUTE_NODE) ||
          (ctxt->context->node->type == XML_NAMESPACE_DECL)) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else if ((xmlDocPtr)cur == ctxt->context->doc) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else if (cur == (xmlNodePtr)0x0) {
    ctxt_local = (xmlXPathParserContextPtr)ctxt->context->node->next;
  }
  else {
    ctxt_local = (xmlXPathParserContextPtr)cur->next;
  }
  return (xmlNodePtr)ctxt_local;
}

Assistant:

xmlNodePtr
xmlXPathNextFollowingSibling(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if ((ctxt->context->node->type == XML_ATTRIBUTE_NODE) ||
	(ctxt->context->node->type == XML_NAMESPACE_DECL))
	return(NULL);
    if (cur == (xmlNodePtr) ctxt->context->doc)
        return(NULL);
    if (cur == NULL)
        return(ctxt->context->node->next);
    return(cur->next);
}